

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::InverseCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  v3i *M;
  int iVar1;
  undefined1 *puVar2;
  char *__function;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  u64 TransformOrder;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  grid *pgVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  v3i R3;
  v3i D3;
  v3i S3;
  grid_iterator<signed_char> ItEnd;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:354:5)>
  __ScopeGuard__354;
  grid_iterator<signed_char> It;
  stack_array<int,_32> StackAxes;
  wav_basis_norms_static<16> BasisNorms;
  stack_array<idx2::grid,_32> StackGrids;
  ulong local_5c8;
  uint local_5c0;
  ulong local_5b8;
  uint local_5b0;
  v3i *local_5a8;
  ulong local_59c;
  uint local_594;
  grid_iterator<double> local_590;
  v3i *local_558;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:354:5)>
  local_550;
  grid_iterator<double> local_540;
  array<idx2::subband> local_508;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458;
  undefined1 local_448 [136];
  undefined1 local_3c0 [112];
  grid gStack_350;
  undefined1 local_338 [16];
  ulong local_328 [95];
  
  uVar11 = 0;
  local_558 = M3;
  memset(local_338,0,0x301);
  auVar14 = ZEXT816(0) << 0x40;
  local_478 = ZEXT1632(auVar14);
  local_498 = ZEXT1632(auVar14);
  local_4b8 = ZEXT1632(auVar14);
  local_4d8 = ZEXT1632(auVar14);
  local_458 = 0;
  local_5b0 = (Dims3->field_0).field_0.Z;
  local_5b8 = *(ulong *)&Dims3->field_0;
  local_5c0 = (Dims3->field_0).field_0.Z;
  local_5c8 = *(ulong *)&Dims3->field_0;
  local_59c = 0x100000001;
  local_594 = 1;
  local_5a8 = Dims3;
  uVar5 = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
          ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
          (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
  uVar4 = 0x40000200001;
  iVar3 = 0;
  do {
    uVar11 = (ulong)(int)uVar11;
    puVar6 = local_328 + uVar11 * 3;
    TransformOrder = TformOrder;
    while( true ) {
      if (NLevels <= iVar3) {
        if (!Normalize || NLevels < 1) goto LAB_0018009c;
        Mallocator();
        Mallocator();
        local_550.Func.Subbands = &local_508;
        local_508.Buffer.Data = (byte *)0x0;
        local_508.Buffer.Bytes = 0;
        local_508.Buffer.Alloc = &Mallocator::Instance.super_allocator;
        local_508.Size = 0;
        local_508.Capacity = 0;
        local_508.Alloc = &Mallocator::Instance.super_allocator;
        local_550.Dismissed = false;
        BuildSubbands(local_5a8,NLevels,TransformOrder,local_550.Func.Subbands);
        GetCdf53NormsFast<16>();
        iVar3 = NLevels * Iter;
        lVar12 = 0;
        goto LAB_0017fc1a;
      }
      uVar8 = (uint)TransformOrder;
      uVar7 = uVar8 & 3;
      TransformOrder = TransformOrder >> 2;
      if (uVar7 == 3) break;
      if (0x1f < (int)uVar11) {
        __function = 
        "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]";
        goto LAB_00180193;
      }
      puVar6[-2] = 0;
      puVar6[-1] = uVar5;
      *puVar6 = uVar4;
      *(uint *)(local_4d8 + uVar11 * 4) = uVar7;
      uVar9 = (ulong)((uVar8 & 3) << 2);
      uVar7 = *(uint *)((long)&local_5b8 + uVar9) | 1;
      *(uint *)((long)&local_5c8 + uVar9) = uVar7;
      uVar5 = (ulong)(local_5c0 & 0x1fffff) << 0x2a |
              (local_5c8 >> 0x20 & 0x1fffff) << 0x15 | local_5c8 & 0x1fffff;
      *(int *)((long)&local_59c + uVar9) = *(int *)((long)&local_59c + uVar9) << 1;
      *(int *)((long)&local_5b8 + uVar9) = (int)(uVar7 + 1) >> 1;
      uVar11 = uVar11 + 1;
      puVar6 = puVar6 + 3;
    }
    if (TransformOrder != 3) {
      TformOrder = TransformOrder;
    }
    uVar4 = (ulong)(local_594 & 0x1fffff) << 0x2a |
            (local_59c >> 0x20 & 0x1fffff) << 0x15 | local_59c & 0x1fffff;
    local_5c0 = local_5b0;
    uVar5 = (ulong)(local_5b0 & 0x1fffff) << 0x2a |
            (local_5b8 >> 0x20 & 0x1fffff) << 0x15 | local_5b8 & 0x1fffff;
    local_5c8 = local_5b8;
    iVar3 = iVar3 + 1;
  } while( true );
LAB_0017fc1a:
  if (local_508.Size <= lVar12) {
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Wavelet.cpp:354:5)>
    ::~scope_guard(&local_550);
LAB_0018009c:
    M = local_558;
    uVar11 = uVar11 & 0xffffffff;
    pgVar10 = &gStack_350 + uVar11;
    while( true ) {
      if ((int)uVar11 < 1) {
        return;
      }
      if (0x20 < uVar11) break;
      if (Vol->Type < __Invalid__) {
        iVar3 = *(int *)(local_4d8 + uVar11 * 4 + -4);
        if (iVar3 == 2) {
          ILiftCdf53Z<double>(pgVar10,M,Normal,Vol);
        }
        else if (iVar3 == 1) {
          ILiftCdf53Y<double>(pgVar10,M,Normal,Vol);
        }
        else if (iVar3 == 0) {
          ILiftCdf53X<double>(pgVar10,M,Normal,Vol);
        }
      }
      pgVar10 = pgVar10 + -1;
      uVar11 = uVar11 - 1;
    }
    __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
LAB_00180193:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,__function);
  }
  dVar13 = 1.0;
  pgVar10 = (grid *)(local_508.Buffer.Data + lVar12 * 0x40);
  if ((local_5a8->field_0).field_0.X != 1) {
    iVar1 = *(char *)((long)&pgVar10[2].super_extent.From + 3) + iVar3;
    if (*(char *)((long)&pgVar10[2].super_extent.From + 6) == '\0') {
      if (iVar1 < 0x11) {
        iVar1 = iVar1 + -1;
        puVar2 = local_448;
        goto LAB_0017fc7c;
      }
    }
    else {
      puVar2 = local_3c0;
      if (iVar1 < 0x10) {
LAB_0017fc7c:
        dVar13 = *(double *)(puVar2 + (long)iVar1 * 8);
        goto LAB_0017fc83;
      }
    }
    goto LAB_0018017e;
  }
LAB_0017fc83:
  dVar15 = 1.0;
  if ((local_5a8->field_0).field_0.Y != 1) {
    iVar1 = *(char *)((long)&pgVar10[2].super_extent.From + 4) + iVar3;
    if (*(char *)((long)&pgVar10[2].super_extent.From + 7) == '\0') {
      if (iVar1 < 0x11) {
        iVar1 = iVar1 + -1;
        puVar2 = local_448;
        goto LAB_0017fcc9;
      }
    }
    else {
      puVar2 = local_3c0;
      if (iVar1 < 0x10) {
LAB_0017fcc9:
        dVar15 = *(double *)(puVar2 + (long)iVar1 * 8);
        goto LAB_0017fcd0;
      }
    }
    goto LAB_0018017e;
  }
LAB_0017fcd0:
  dVar16 = 1.0;
  if ((local_5a8->field_0).field_0.Z != 1) {
    iVar1 = *(char *)((long)&pgVar10[2].super_extent.From + 5) + iVar3;
    if ((char)pgVar10[2].super_extent.Dims == '\0') {
      if (iVar1 < 0x11) {
        iVar1 = iVar1 + -1;
        puVar2 = local_448;
        goto LAB_0017fd16;
      }
    }
    else {
      puVar2 = local_3c0;
      if (iVar1 < 0x10) {
LAB_0017fd16:
        dVar16 = *(double *)(puVar2 + (long)iVar1 * 8);
        goto LAB_0017fd1d;
      }
    }
LAB_0018017e:
    __function = "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
    goto LAB_00180193;
  }
LAB_0017fd1d:
  if (Vol->Type < __Invalid__) {
    dVar13 = 1.0 / (dVar13 * dVar15 * dVar16);
    switch(Vol->Type) {
    case int8:
      End<signed_char>((grid_iterator<signed_char> *)&local_590,pgVar10,Vol);
      Begin<signed_char>((grid_iterator<signed_char> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(char *)local_540.Ptr = (char)(int)((double)(int)*(char *)local_540.Ptr * dVar13);
        grid_iterator<signed_char>::operator++((grid_iterator<signed_char> *)&local_540);
      }
      break;
    case uint8:
      End<unsigned_char>((grid_iterator<unsigned_char> *)&local_590,pgVar10,Vol);
      Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(char *)local_540.Ptr = (char)(int)((double)*(byte *)local_540.Ptr * dVar13);
        grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&local_540);
      }
      break;
    case int16:
      End<short>((grid_iterator<short> *)&local_590,pgVar10,Vol);
      Begin<short>((grid_iterator<short> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(short *)local_540.Ptr = (short)(int)((double)(int)*(short *)local_540.Ptr * dVar13);
        grid_iterator<short>::operator++((grid_iterator<short> *)&local_540);
      }
      break;
    case uint16:
      End<unsigned_short>((grid_iterator<unsigned_short> *)&local_590,pgVar10,Vol);
      Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(short *)local_540.Ptr = (short)(int)((double)*(ushort *)local_540.Ptr * dVar13);
        grid_iterator<unsigned_short>::operator++((grid_iterator<unsigned_short> *)&local_540);
      }
      break;
    case int32:
      End<int>((grid_iterator<int> *)&local_590,pgVar10,Vol);
      Begin<int>((grid_iterator<int> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(int *)local_540.Ptr = (int)((double)(int)*(float *)local_540.Ptr * dVar13);
        grid_iterator<int>::operator++((grid_iterator<int> *)&local_540);
      }
      break;
    case uint32:
      End<unsigned_int>((grid_iterator<unsigned_int> *)&local_590,pgVar10,Vol);
      Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(float *)local_540.Ptr = (float)(long)((double)(uint)*(float *)local_540.Ptr * dVar13);
        grid_iterator<unsigned_int>::operator++((grid_iterator<unsigned_int> *)&local_540);
      }
      break;
    case int64:
      End<long>((grid_iterator<long> *)&local_590,pgVar10,Vol);
      Begin<long>((grid_iterator<long> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *local_540.Ptr = (double)(long)((double)(long)*local_540.Ptr * dVar13);
        grid_iterator<long>::operator++((grid_iterator<long> *)&local_540);
      }
      break;
    case uint64:
      End<unsigned_long>((grid_iterator<unsigned_long> *)&local_590,pgVar10,Vol);
      Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *local_540.Ptr;
        auVar14 = vunpcklps_avx(auVar14,_DAT_00199c70);
        auVar14 = vsubpd_avx(auVar14,_DAT_00199c80);
        dVar15 = (auVar14._0_8_ + auVar14._8_8_) * dVar13;
        uVar4 = (ulong)dVar15;
        *local_540.Ptr =
             (double)((long)(dVar15 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
        grid_iterator<unsigned_long>::operator++((grid_iterator<unsigned_long> *)&local_540);
      }
      break;
    case float32:
      End<float>((grid_iterator<float> *)&local_590,pgVar10,Vol);
      Begin<float>((grid_iterator<float> *)&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *(float *)local_540.Ptr = (float)((double)*(float *)local_540.Ptr * dVar13);
        grid_iterator<float>::operator++((grid_iterator<float> *)&local_540);
      }
      break;
    case float64:
      End<double>(&local_590,pgVar10,Vol);
      Begin<double>(&local_540,pgVar10,Vol);
      while (local_540.Ptr != local_590.Ptr) {
        *local_540.Ptr = dVar13 * *local_540.Ptr;
        grid_iterator<double>::operator++(&local_540);
      }
    }
  }
  lVar12 = lVar12 + 1;
  goto LAB_0017fc1a;
}

Assistant:

void
InverseCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  /* "simulate" the forward transform */
  stack_array<grid, 32> StackGrids;
  stack_array<int, 32> StackAxes;
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int Iteration = 0;
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
      StackGrids[Iteration] = G;
      StackAxes[Iteration++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* inverse normalize if required */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }

  /* perform the inverse transform */
  while (Iteration-- > 0)
  {
    int D = StackAxes[Iteration];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}